

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.h
# Opt level: O3

RecyclerTestObject * Location::Tag(RecyclerTestObject *untagged)

{
  PageHeapData *pPVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined7 extraout_var;
  ulong uVar5;
  byte *pbVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  undefined4 *in_FS_OFFSET;
  
  if (untagged == (RecyclerTestObject *)0x0) {
    return (RecyclerTestObject *)0x0;
  }
  if (((ulong)untagged & 1) == 0) {
    return (RecyclerTestObject *)((ulong)untagged | 1);
  }
  Tag();
  uVar4 = (uint)((RecyclerHeapObjectInfo *)untagged)->m_heapBlock->heapBlockType;
  uVar7 = extraout_RDX;
  if ((uVar4 < 0xb) && ((0x528U >> (uVar4 & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x8c2,"(!m_heapBlock->IsAnyFinalizableBlock())",
                       "!m_heapBlock->IsAnyFinalizableBlock()");
    if (!bVar3) goto LAB_001bbc50;
    *in_FS_OFFSET = 0;
    uVar7 = extraout_RDX_00;
  }
  if (((((RecyclerHeapObjectInfo *)untagged)->m_recycler->isPageHeapEnabled == true) &&
      (((RecyclerHeapObjectInfo *)untagged)->m_recycler->capturePageHeapFreeStack == true)) &&
     (((RecyclerHeapObjectInfo *)untagged)->isUsingLargeHeapBlock == true)) {
    pPVar1 = ((LargeHeapBlock *)((RecyclerHeapObjectInfo *)untagged)->m_heapBlock)->pageHeapData;
    if ((pPVar1 != (PageHeapData *)0x0) && (pPVar1->pageHeapMode != PageHeapModeOff)) {
      Memory::LargeHeapBlock::CapturePageHeapFreeStack
                ((LargeHeapBlock *)((RecyclerHeapObjectInfo *)untagged)->m_heapBlock);
      uVar7 = extraout_RDX_01;
    }
  }
  if (((RecyclerHeapObjectInfo *)untagged)->isUsingLargeHeapBlock == true) {
    bVar3 = Memory::RecyclerHeapObjectInfo::ClearImplicitRootBitsForLargeHeapBlock
                      ((RecyclerHeapObjectInfo *)untagged);
    return (RecyclerTestObject *)CONCAT71(extraout_var,bVar3);
  }
  pbVar6 = (((RecyclerHeapObjectInfo *)untagged)->field_3).m_attributes;
  if (pbVar6 == (byte *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x8db,"(m_attributes)","m_attributes");
    if (!bVar3) {
LAB_001bbc50:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *in_FS_OFFSET = 0;
    pbVar6 = (((RecyclerHeapObjectInfo *)untagged)->field_3).m_attributes;
    uVar7 = extraout_RDX_02;
  }
  uVar5 = CONCAT71((int7)((ulong)uVar7 >> 8),*pbVar6) & 0xffffff08;
  *pbVar6 = *pbVar6 & 0xf7;
  return (RecyclerTestObject *)CONCAT71((int7)(uVar5 >> 8),(byte)uVar5 >> 3);
}

Assistant:

static RecyclerTestObject * Tag(RecyclerTestObject * untagged)
    {
        if (untagged == nullptr)
        {
            return nullptr;
        }
        else
        {
            size_t value = (size_t)untagged;
            VerifyCondition((value & 0x1) == 0);
            value |= 0x1;
            return (RecyclerTestObject *)value;
        }
    }